

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::member_attribute_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t index)

{
  StorageClass SVar1;
  string *psVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  ExecutionModel EVar6;
  uint uVar7;
  SPIREntryPoint *pSVar8;
  size_type sVar9;
  SPIRType *pSVar10;
  ulong uVar11;
  CompilerError *pCVar12;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char (*in_R8) [4];
  char (*in_stack_ffffffffffffff28) [4];
  BuiltIn builtin;
  allocator local_c1;
  string *local_c0;
  string loc_qual;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  SPIRType *local_38;
  
  pSVar8 = Compiler::get_entry_point((Compiler *)this);
  local_38 = Compiler::get<spirv_cross::SPIRType>
                       ((Compiler *)this,
                        (type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id
                       );
  builtin = BuiltInMax;
  bVar3 = Compiler::is_member_builtin((Compiler *)this,type,index,&builtin);
  bVar4 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationResourceIndexPrimary);
  if (bVar4) {
    uVar5 = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationResourceIndexPrimary);
    loc_qual._M_dataplus._M_p._0_4_ = uVar5;
    join<char_const(&)[7],unsigned_int,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)" [[id(",(char (*) [7])&loc_qual,
               (uint *)0x39e39a,(char (*) [2])in_R8);
    uVar5 = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationInterfaceOrigID);
    loc_qual._M_dataplus._M_p._0_4_ = uVar5;
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,
                    (key_type *)&loc_qual);
    if (sVar9 != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  EVar6 = pSVar8->model;
  local_c0 = __return_storage_ptr__;
  if ((EVar6 == ExecutionModelVertex) && (type->storage == StorageClassInput)) {
    if (bVar3) {
      if (((0x2b < (ulong)builtin) || ((0xc0000000060U >> ((ulong)builtin & 0x3f) & 1) == 0)) &&
         (1 < builtin - BuiltInBaseVertex)) {
        if (builtin == BuiltInDrawIndex) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&loc_qual,"DrawIndex is not supported in MSL.",(allocator *)&local_98
                    );
          CompilerError::CompilerError(pCVar12,&loc_qual);
          __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        goto LAB_0031d037;
      }
      if ((this->msl_options).vertex_for_tessellation == true) goto LAB_0031d037;
      ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
      ::std::operator+(&loc_qual,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
    }
    else {
      uVar5 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
      if (uVar5 == 0xffffffff) {
        EVar6 = pSVar8->model;
        goto LAB_0031cc8f;
      }
      ::std::__cxx11::string::string((string *)&local_98," [[attribute(",(allocator *)&local_58);
      __return_storage_ptr__ = local_c0;
      ::std::__cxx11::to_string(&local_78,uVar5);
      ::std::operator+(&loc_qual,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&loc_qual,")]]");
    }
    goto LAB_0031cc69;
  }
LAB_0031cc8f:
  if ((((EVar6 == ExecutionModelVertex) && ((this->msl_options).vertex_for_tessellation != true)) ||
      (bVar4 = is_tese_shader(this), bVar4)) &&
     (__return_storage_ptr__ = local_c0, type->storage == StorageClassOutput)) {
    if (!bVar3) {
      member_location_attribute_qualifier_abi_cxx11_(&loc_qual,this,type,index);
      __return_storage_ptr__ = local_c0;
      if (loc_qual._M_string_length == 0) {
        ::std::__cxx11::string::~string((string *)&loc_qual);
        goto LAB_0031cd9e;
      }
      join<char_const(&)[4],std::__cxx11::string&,char_const(&)[3]>
                (local_c0,(spirv_cross *)" [[",(char (*) [4])&loc_qual,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b3013,
                 (char (*) [3])in_R8);
      goto LAB_0031cd8a;
    }
    switch(builtin) {
    case BuiltInPointSize:
      if ((this->msl_options).enable_point_size_builtin != true) goto LAB_0031d037;
      ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
      builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
      ::std::operator+(&loc_qual,&local_98,&local_78);
      ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
      goto LAB_0031cc69;
    default:
      goto switchD_0031cce2_caseD_2;
    case BuiltInClipDistance:
      bVar3 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationIndex);
      __return_storage_ptr__ = local_c0;
      if (bVar3) {
        uVar5 = Compiler::get_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                           DecorationIndex);
        loc_qual._M_dataplus._M_p._0_4_ = uVar5;
        pcVar13 = " [[user(clip";
LAB_0031d284:
        join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                  (__return_storage_ptr__,(spirv_cross *)pcVar13,(char (*) [13])&loc_qual,
                   (uint *)")]]",in_R8);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
      builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
      ::std::operator+(&local_98,&local_78,&local_58);
      ::std::operator+(&loc_qual,&local_98,"]]");
      pcVar13 = " ";
      if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        pcVar13 = "";
      }
      ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar13);
      break;
    case BuiltInCullDistance:
      bVar3 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationIndex);
      __return_storage_ptr__ = local_c0;
      if (bVar3) {
        uVar5 = Compiler::get_member_decoration
                          ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                           DecorationIndex);
        loc_qual._M_dataplus._M_p._0_4_ = uVar5;
        pcVar13 = " [[user(cull";
        goto LAB_0031d284;
      }
      ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
      builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
      ::std::operator+(&local_98,&local_78,&local_58);
      ::std::operator+(&loc_qual,&local_98,"]]");
      pcVar13 = " ";
      if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        pcVar13 = "";
      }
      ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar13);
      break;
    case BuiltInViewportIndex:
      if ((this->msl_options).msl_version < 20000) {
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&loc_qual,"ViewportIndex requires Metal 2.0.",(allocator *)&local_98);
        CompilerError::CompilerError(pCVar12,&loc_qual);
        __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    case BuiltInPosition:
    case BuiltInLayer:
      ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
      __return_storage_ptr__ = local_c0;
      builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
      ::std::operator+(&local_98,&local_78,&local_58);
      ::std::operator+(&loc_qual,&local_98,"]]");
      pcVar13 = " ";
      if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        pcVar13 = "";
      }
      ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar13);
    }
LAB_0031d1c8:
    ::std::__cxx11::string::~string((string *)&loc_qual);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_58);
    this_00 = &local_78;
LAB_0031d1ee:
    ::std::__cxx11::string::~string((string *)this_00);
    return __return_storage_ptr__;
  }
LAB_0031cd9e:
  if (((pSVar8->model == ExecutionModelVertex) &&
      ((this->msl_options).vertex_for_tessellation == true)) &&
     (type->storage == StorageClassOutput)) {
LAB_0031cf4b:
    if (bVar3) {
      get_or_allocate_builtin_output_member_location
                (this,builtin,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
    }
  }
  else {
    bVar4 = is_tesc_shader(this);
    if ((!bVar4) || (type->storage != StorageClassInput)) {
LAB_0031cf35:
      bVar4 = is_tesc_shader(this);
      if ((bVar4) && (type->storage == StorageClassOutput)) goto LAB_0031cf4b;
      bVar4 = is_tese_shader(this);
      SVar1 = type->storage;
      if (SVar1 == StorageClassInput && bVar4) {
        if (bVar3) {
          if (builtin != BuiltInPrimitiveId) {
            if (builtin == BuiltInPatchVertices) goto switchD_0031cce2_caseD_2;
            if (builtin != BuiltInTessCoord) goto LAB_0031d044;
          }
          ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
          builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
          __return_storage_ptr__ = local_c0;
          ::std::operator+(&loc_qual,&local_98,&local_78);
          ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
        }
        else {
LAB_0031d044:
          if (((this->msl_options).raw_buffer_tese_input == true) ||
             (pSVar10 = Compiler::get_type((Compiler *)this,
                                           (TypeID)(type->member_types).
                                                                                                      
                                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                                  .ptr[index].id),
             *(int *)&(pSVar10->super_IVariant).field_0xc == 0x15)) goto switchD_0031cce2_caseD_2;
          if (bVar3) {
            in_R8 = (char (*) [4])0x0;
            uVar7 = get_or_allocate_builtin_input_member_location
                              (this,builtin,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
          }
          else {
            uVar7 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
          }
          if (uVar7 == 0xffffffff) {
            SVar1 = type->storage;
            goto LAB_0031d441;
          }
          ::std::__cxx11::string::string((string *)&local_98," [[attribute(",(allocator *)&local_58)
          ;
          ::std::__cxx11::to_string(&local_78,uVar7);
          __return_storage_ptr__ = local_c0;
          ::std::operator+(&loc_qual,&local_98,&local_78);
          ::std::operator+(__return_storage_ptr__,&loc_qual,")]]");
        }
      }
      else {
LAB_0031d441:
        EVar6 = pSVar8->model;
        if (SVar1 == StorageClassInput && EVar6 == ExecutionModelFragment) {
          loc_qual._M_dataplus._M_p = (pointer)&loc_qual.field_2;
          loc_qual._M_string_length = 0;
          loc_qual.field_2._M_local_buf[0] = '\0';
          if (bVar3) {
            if (BuiltInSampleMask < builtin) {
LAB_0031d4e0:
              if ((builtin - BuiltInBaryCoordKHR < 2) ||
                 (((builtin == BuiltInViewIndex && ((this->msl_options).multiview == true)) &&
                  ((this->msl_options).multiview_layered_rendering == true)))) {
LAB_0031d4ef:
                builtin_qualifier_abi_cxx11_(&local_98,this,builtin);
                goto LAB_0031d4fc;
              }
              goto LAB_0031d516;
            }
            if ((0x178200U >> (builtin & BuiltInGlobalSize) & 1) != 0) goto LAB_0031d4ef;
            if (builtin == BuiltInClipDistance) {
              local_98._M_dataplus._M_p._0_4_ =
                   Compiler::get_member_decoration
                             ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                              DecorationIndex);
              __return_storage_ptr__ = local_c0;
              join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                        (local_c0,(spirv_cross *)" [[user(clip",(char (*) [13])&local_98,
                         (uint *)")]]",in_R8);
            }
            else {
              if (builtin != BuiltInCullDistance) goto LAB_0031d4e0;
              local_98._M_dataplus._M_p._0_4_ =
                   Compiler::get_member_decoration
                             ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                              DecorationIndex);
              __return_storage_ptr__ = local_c0;
              join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                        (local_c0,(spirv_cross *)" [[user(cull",(char (*) [13])&local_98,
                         (uint *)")]]",in_R8);
            }
          }
          else {
            member_location_attribute_qualifier_abi_cxx11_(&local_98,this,type,index);
LAB_0031d4fc:
            ::std::__cxx11::string::operator=((string *)&loc_qual,(string *)&local_98);
            ::std::__cxx11::string::~string((string *)&local_98);
LAB_0031d516:
            if (((builtin & ~BuiltInPointSize) == BuiltInBaryCoordKHR) &&
               (((bVar4 = Compiler::has_member_decoration
                                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                     DecorationFlat), bVar4 ||
                 (bVar4 = Compiler::has_member_decoration
                                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                     DecorationCentroid), bVar4)) ||
                ((bVar4 = Compiler::has_member_decoration
                                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                     DecorationSample), bVar4 ||
                 (bVar4 = Compiler::has_member_decoration
                                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                     DecorationNoPerspective), bVar4)))))) {
              pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_98,
                         "Flat, Centroid, Sample, NoPerspective decorations are not supported for BaryCoord inputs."
                         ,(allocator *)&local_78);
              CompilerError::CompilerError(pCVar12,&local_98);
              __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            if ((7 < *(int *)&(local_38->super_IVariant).field_0xc - 3U) &&
               (!bVar3 || builtin != BuiltInFragCoord)) {
              bVar4 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationFlat);
              if (bVar4) {
                if (loc_qual._M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)&loc_qual);
                }
              }
              else {
                bVar4 = Compiler::has_member_decoration
                                  ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                   DecorationCentroid);
                if (bVar4) {
                  if (loc_qual._M_string_length != 0) {
                    ::std::__cxx11::string::append((char *)&loc_qual);
                  }
                  Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                             DecorationNoPerspective);
                }
                else {
                  bVar4 = Compiler::has_member_decoration
                                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                     DecorationSample);
                  if (bVar4) {
                    if (loc_qual._M_string_length != 0) {
                      ::std::__cxx11::string::append((char *)&loc_qual);
                    }
                    Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                               DecorationNoPerspective);
                  }
                  else {
                    bVar4 = Compiler::has_member_decoration
                                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index
                                       ,DecorationNoPerspective);
                    if (!bVar4) goto LAB_0031d6cf;
                    if (loc_qual._M_string_length != 0) {
                      ::std::__cxx11::string::append((char *)&loc_qual);
                    }
                  }
                }
              }
              ::std::__cxx11::string::append((char *)&loc_qual);
            }
LAB_0031d6cf:
            if (loc_qual._M_string_length == 0) {
              ::std::__cxx11::string::~string((string *)&loc_qual);
              EVar6 = pSVar8->model;
              SVar1 = type->storage;
              goto LAB_0031d72e;
            }
            ::std::operator+(&local_98," [[",&loc_qual);
            __return_storage_ptr__ = local_c0;
            ::std::operator+(local_c0,&local_98,"]]");
            ::std::__cxx11::string::~string((string *)&local_98);
          }
LAB_0031cd8a:
          this_00 = &loc_qual;
          goto LAB_0031d1ee;
        }
LAB_0031d72e:
        __return_storage_ptr__ = local_c0;
        if ((EVar6 == ExecutionModelFragment) && (SVar1 == StorageClassOutput)) {
          if (!bVar3) {
            uVar5 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
            loc_qual._M_dataplus._M_p._0_4_ = uVar5;
            if (uVar5 == 0xffffffff) {
              bVar3 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationIndex);
              if (bVar3) {
                local_98._M_dataplus._M_p._0_4_ =
                     Compiler::get_member_decoration
                               ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                DecorationIndex);
                join<char_const(&)[10],unsigned_int,char_const(&)[4]>
                          (__return_storage_ptr__,(spirv_cross *)" [[index(",
                           (char (*) [10])&local_98,(uint *)")]]",in_R8);
                return __return_storage_ptr__;
              }
              ::std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,"",(allocator *)&local_98);
              return __return_storage_ptr__;
            }
            if (((this->msl_options).enable_frag_output_mask >> (uVar5 & 0x1f) & 1) != 0) {
              bVar3 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                 DecorationIndex);
              if (bVar3) {
                local_98._M_dataplus._M_p._0_4_ =
                     Compiler::get_member_decoration
                               ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                                DecorationIndex);
                join<char_const(&)[10],unsigned_int&,char_const(&)[10],unsigned_int,char_const(&)[4]>
                          (__return_storage_ptr__,(spirv_cross *)" [[color(",
                           (char (*) [10])&loc_qual,(uint *)"), index(",(char (*) [10])&local_98,
                           (uint *)")]]",in_stack_ffffffffffffff28);
                return __return_storage_ptr__;
              }
              join<char_const(&)[10],unsigned_int&,char_const(&)[4]>
                        (__return_storage_ptr__,(spirv_cross *)" [[color(",(char (*) [10])&loc_qual,
                         (uint *)")]]",in_R8);
              return __return_storage_ptr__;
            }
            ::std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"",(allocator *)&local_98);
            return __return_storage_ptr__;
          }
          if (builtin != BuiltInSampleMask) {
            if (builtin != BuiltInFragDepth) {
              if ((builtin != BuiltInFragStencilRefEXT) ||
                 ((this->msl_options).enable_frag_stencil_ref_builtin == false)) goto LAB_0031d037;
              if ((this->msl_options).msl_version < 0x4e84) {
                pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&loc_qual,"Stencil export only supported in MSL 2.1 and up.",
                           (allocator *)&local_98);
                CompilerError::CompilerError(pCVar12,&loc_qual);
                __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
              builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
              ::std::operator+(&loc_qual,&local_98,&local_78);
              ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
              goto LAB_0031cc69;
            }
            if ((this->msl_options).enable_frag_depth_builtin == false) goto LAB_0031d037;
          }
          ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
          builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
          ::std::operator+(&loc_qual,&local_98,&local_78);
          ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
        }
        else {
          if (((!bVar3 || (SVar1 != StorageClassInput || EVar6 != ExecutionModelGLCompute)) ||
              (uVar11 = (ulong)builtin, 0x29 < uVar11)) ||
             (((0x3d000000UL >> (uVar11 & 0x3f) & 1) == 0 &&
              (((0x35000000000U >> (uVar11 & 0x3f) & 1) == 0 ||
               ((this->msl_options).emulate_subgroups != false)))))) goto LAB_0031d037;
          ::std::__cxx11::string::string((string *)&local_98," [[",(allocator *)&local_58);
          builtin_qualifier_abi_cxx11_(&local_78,this,builtin);
          ::std::operator+(&loc_qual,&local_98,&local_78);
          ::std::operator+(__return_storage_ptr__,&loc_qual,"]]");
        }
      }
LAB_0031cc69:
      ::std::__cxx11::string::~string((string *)&loc_qual);
      ::std::__cxx11::string::~string((string *)&local_78);
      this_00 = &local_98;
      goto LAB_0031d1ee;
    }
    if (bVar3) {
      if (builtin - BuiltInPrimitiveId < 2) {
        if ((this->msl_options).multi_patch_workgroup != true) {
          ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
          __return_storage_ptr__ = local_c0;
          builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
          ::std::operator+(&local_98,&local_78,&local_58);
          ::std::operator+(&loc_qual,&local_98,"]]");
          pcVar13 = " ";
          if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            pcVar13 = "";
          }
          ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar13);
          goto LAB_0031d1c8;
        }
      }
      else if (builtin != BuiltInPatchVertices) {
        if ((builtin == BuiltInSubgroupSize) || (builtin == BuiltInSubgroupLocalInvocationId)) {
          if ((this->msl_options).emulate_subgroups != true) {
            ::std::__cxx11::string::string((string *)&local_78," [[",&local_c1);
            __return_storage_ptr__ = local_c0;
            builtin_qualifier_abi_cxx11_(&local_58,this,builtin);
            ::std::operator+(&local_98,&local_78,&local_58);
            ::std::operator+(&loc_qual,&local_98,"]]");
            pcVar13 = " ";
            if ((local_38->array).super_VectorView<unsigned_int>.buffer_size == 0) {
              pcVar13 = "";
            }
            ::std::operator+(__return_storage_ptr__,&loc_qual,pcVar13);
            goto LAB_0031d1c8;
          }
        }
        else if ((this->msl_options).multi_patch_workgroup == false) {
          in_R8 = (char (*) [4])0x0;
          uVar7 = get_or_allocate_builtin_input_member_location
                            (this,builtin,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
          goto LAB_0031ced7;
        }
      }
    }
    else if ((this->msl_options).multi_patch_workgroup != true) {
      uVar7 = get_member_location(this,(type->super_IVariant).self.id,index,(uint32_t *)0x0);
LAB_0031ced7:
      if (uVar7 != 0xffffffff) {
        ::std::__cxx11::string::string((string *)&local_98," [[attribute(",(allocator *)&local_58);
        ::std::__cxx11::to_string(&local_78,uVar7);
        __return_storage_ptr__ = local_c0;
        ::std::operator+(&loc_qual,&local_98,&local_78);
        ::std::operator+(__return_storage_ptr__,&loc_qual,")]]");
        goto LAB_0031cc69;
      }
      goto LAB_0031cf35;
    }
  }
switchD_0031cce2_caseD_2:
LAB_0031d037:
  psVar2 = local_c0;
  ::std::__cxx11::string::string((string *)local_c0,"",(allocator *)&loc_qual);
  return psVar2;
}

Assistant:

string CompilerMSL::member_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	auto &execution = get_entry_point();

	uint32_t mbr_type_id = type.member_types[index];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(type, index, &builtin);

	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
	{
		string quals = join(
		    " [[id(", get_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary), ")");
		if (interlocked_resources.count(
		        get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID)))
			quals += ", raster_order_group(0)";
		quals += "]]";
		return quals;
	}

	// Vertex function inputs
	if (execution.model == ExecutionModelVertex && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInVertexId:
			case BuiltInVertexIndex:
			case BuiltInBaseVertex:
			case BuiltInInstanceId:
			case BuiltInInstanceIndex:
			case BuiltInBaseInstance:
				if (msl_options.vertex_for_tessellation)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInDrawIndex:
				SPIRV_CROSS_THROW("DrawIndex is not supported in MSL.");

			default:
				return "";
			}
		}

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Vertex and tessellation evaluation function outputs
	if (((execution.model == ExecutionModelVertex && !msl_options.vertex_for_tessellation) || is_tese_shader()) &&
	    type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPointSize:
				// Only mark the PointSize builtin if really rendering points.
				// Some shaders may include a PointSize builtin even when used to render
				// non-point topologies, and Metal will reject this builtin when compiling
				// the shader into a render pipeline that uses a non-point topology.
				return msl_options.enable_point_size_builtin ? (string(" [[") + builtin_qualifier(builtin) + "]]") : "";

			case BuiltInViewportIndex:
				if (!msl_options.supports_msl_version(2, 0))
					SPIRV_CROSS_THROW("ViewportIndex requires Metal 2.0.");
				/* fallthrough */
			case BuiltInPosition:
			case BuiltInLayer:
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInClipDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInCullDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			default:
				return "";
			}
		}
		string loc_qual = member_location_attribute_qualifier(type, index);
		if (!loc_qual.empty())
			return join(" [[", loc_qual, "]]");
	}

	if (execution.model == ExecutionModelVertex && msl_options.vertex_for_tessellation && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation control function inputs
	if (is_tesc_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInInvocationId:
			case BuiltInPrimitiveId:
				if (msl_options.multi_patch_workgroup)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}
		if (msl_options.multi_patch_workgroup)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation control function outputs
	if (is_tesc_shader() && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation evaluation function inputs
	if (is_tese_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPrimitiveId:
			case BuiltInTessCoord:
				return string(" [[") + builtin_qualifier(builtin) + "]]";
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}

		if (msl_options.raw_buffer_tese_input)
			return "";

		// The special control point array must not be marked with an attribute.
		if (get_type(type.member_types[index]).basetype == SPIRType::ControlPointArray)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation evaluation function outputs were handled above.

	// Fragment function inputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassInput)
	{
		string quals;
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInViewIndex:
				if (!msl_options.multiview || !msl_options.multiview_layered_rendering)
					break;
				/* fallthrough */
			case BuiltInFrontFacing:
			case BuiltInPointCoord:
			case BuiltInFragCoord:
			case BuiltInSampleId:
			case BuiltInSampleMask:
			case BuiltInLayer:
			case BuiltInBaryCoordKHR:
			case BuiltInBaryCoordNoPerspKHR:
				quals = builtin_qualifier(builtin);
				break;

			case BuiltInClipDistance:
				return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
			case BuiltInCullDistance:
				return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");

			default:
				break;
			}
		}
		else
			quals = member_location_attribute_qualifier(type, index);

		if (builtin == BuiltInBaryCoordKHR || builtin == BuiltInBaryCoordNoPerspKHR)
		{
			if (has_member_decoration(type.self, index, DecorationFlat) ||
			    has_member_decoration(type.self, index, DecorationCentroid) ||
			    has_member_decoration(type.self, index, DecorationSample) ||
			    has_member_decoration(type.self, index, DecorationNoPerspective))
			{
				// NoPerspective is baked into the builtin type.
				SPIRV_CROSS_THROW(
				    "Flat, Centroid, Sample, NoPerspective decorations are not supported for BaryCoord inputs.");
			}
		}

		// Don't bother decorating integers with the 'flat' attribute; it's
		// the default (in fact, the only option). Also don't bother with the
		// FragCoord builtin; it's always noperspective on Metal.
		if (!type_is_integral(mbr_type) && (!is_builtin || builtin != BuiltInFragCoord))
		{
			if (has_member_decoration(type.self, index, DecorationFlat))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "flat";
			}
			else if (has_member_decoration(type.self, index, DecorationCentroid))
			{
				if (!quals.empty())
					quals += ", ";
				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "centroid_no_perspective";
				else
					quals += "centroid_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationSample))
			{
				if (!quals.empty())
					quals += ", ";
				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "sample_no_perspective";
				else
					quals += "sample_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationNoPerspective))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_no_perspective";
			}
		}

		if (!quals.empty())
			return " [[" + quals + "]]";
	}

	// Fragment function outputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInFragStencilRefEXT:
				// Similar to PointSize, only mark FragStencilRef if there's a stencil buffer.
				// Some shaders may include a FragStencilRef builtin even when used to render
				// without a stencil attachment, and Metal will reject this builtin
				// when compiling the shader into a render pipeline that does not set
				// stencilAttachmentPixelFormat.
				if (!msl_options.enable_frag_stencil_ref_builtin)
					return "";
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Stencil export only supported in MSL 2.1 and up.");
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInFragDepth:
				// Ditto FragDepth.
				if (!msl_options.enable_frag_depth_builtin)
					return "";
				/* fallthrough */
			case BuiltInSampleMask:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
		uint32_t locn = get_member_location(type.self, index);
		// Metal will likely complain about missing color attachments, too.
		if (locn != k_unknown_location && !(msl_options.enable_frag_output_mask & (1 << locn)))
			return "";
		if (locn != k_unknown_location && has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[color(", locn, "), index(", get_member_decoration(type.self, index, DecorationIndex),
			            ")]]");
		else if (locn != k_unknown_location)
			return join(" [[color(", locn, ")]]");
		else if (has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[index(", get_member_decoration(type.self, index, DecorationIndex), ")]]");
		else
			return "";
	}

	// Compute function inputs
	if (execution.model == ExecutionModelGLCompute && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInNumSubgroups:
			case BuiltInSubgroupId:
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					break;
				/* fallthrough */
			case BuiltInGlobalInvocationId:
			case BuiltInWorkgroupId:
			case BuiltInNumWorkgroups:
			case BuiltInLocalInvocationId:
			case BuiltInLocalInvocationIndex:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
	}

	return "";
}